

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O1

int read_skip_txfm(AV1_COMMON *cm,MACROBLOCKD *xd,int segment_id,aom_reader *r)

{
  aom_cdf_prob *paVar1;
  ushort uVar2;
  ushort uVar3;
  FRAME_CONTEXT *pFVar4;
  short sVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  aom_cdf_prob (*icdf) [3];
  
  if (((cm->seg).enabled == '\0') ||
     (iVar6 = 1, ((cm->seg).feature_mask[(ulong)(uint)segment_id & 0xff] & 0x40) == 0)) {
    if (xd->above_mbmi == (MB_MODE_INFO *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = (ulong)xd->above_mbmi->skip_txfm;
    }
    if (xd->left_mbmi == (MB_MODE_INFO *)0x0) {
      uVar9 = 0;
    }
    else {
      uVar9 = (ulong)xd->left_mbmi->skip_txfm;
    }
    lVar10 = uVar9 + uVar7;
    pFVar4 = xd->tile_ctx;
    icdf = pFVar4->skip_txfm_cdfs + lVar10;
    iVar6 = od_ec_decode_cdf_q15(&r->ec,*icdf,2);
    if (r->allow_update_cdf != '\0') {
      uVar2 = pFVar4->skip_txfm_cdfs[lVar10][2];
      bVar8 = (char)(uVar2 >> 4) + 4;
      uVar3 = (*icdf)[0];
      if ((char)iVar6 < '\x01') {
        sVar5 = -(uVar3 >> (bVar8 & 0x1f));
      }
      else {
        sVar5 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar8 & 0x1f));
      }
      (*icdf)[0] = sVar5 + uVar3;
      paVar1 = pFVar4->skip_txfm_cdfs[lVar10] + 2;
      *paVar1 = *paVar1 + (ushort)(uVar2 < 0x20);
    }
  }
  return iVar6;
}

Assistant:

static int read_skip_txfm(AV1_COMMON *cm, const MACROBLOCKD *xd, int segment_id,
                          aom_reader *r) {
  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP)) {
    return 1;
  } else {
    const int ctx = av1_get_skip_txfm_context(xd);
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    const int skip_txfm =
        aom_read_symbol(r, ec_ctx->skip_txfm_cdfs[ctx], 2, ACCT_STR);
    return skip_txfm;
  }
}